

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

ON_ClippingPlaneData * __thiscall
ON_ClippingPlaneDataList::FromSerialNumber(ON_ClippingPlaneDataList *this,uint sn)

{
  ON_ClippingPlaneData *pOVar1;
  int iVar2;
  ON_ClippingPlaneData **ppOVar3;
  ON_ClippingPlaneData *data;
  int i;
  int count;
  uint sn_local;
  ON_ClippingPlaneDataList *this_local;
  
  if (sn != 0) {
    iVar2 = ON_SimpleArray<ON_ClippingPlaneData_*>::Count(&this->m_list);
    for (data._4_4_ = 0; data._4_4_ < iVar2; data._4_4_ = data._4_4_ + 1) {
      ppOVar3 = ON_SimpleArray<ON_ClippingPlaneData_*>::operator[](&this->m_list,data._4_4_);
      pOVar1 = *ppOVar3;
      if ((pOVar1 != (ON_ClippingPlaneData *)0x0) && (pOVar1->m_sn == sn)) {
        return pOVar1;
      }
    }
  }
  return (ON_ClippingPlaneData *)0x0;
}

Assistant:

ON_ClippingPlaneData* ON_ClippingPlaneDataList::FromSerialNumber(unsigned int sn)
{
  if (0==sn)
    return nullptr;
  
  // TODO: use binary search
  int count = m_list.Count();
  for (int i=0; i<count; i++)
  {
    ON_ClippingPlaneData* data = m_list[i];
    if (data && data->m_sn == sn)
      return data;
  }
  return nullptr;
}